

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::ClearDependencies
          (cmLocalUnixMakefileGenerator3 *this,cmMakefile *mf,bool verbose)

{
  size_type sVar1;
  pointer pcVar2;
  cmValue cVar3;
  cmState *this_00;
  cmGlobalGenerator *globalGenerator;
  string *psVar4;
  path *ppVar5;
  cmMakefile *this_01;
  pointer filename;
  string_view arg;
  string_view arg_00;
  string dir;
  string internalDependFile;
  string depsFiles;
  string dependFile;
  cmCMakePath DepTimestamp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  cmDependsCompiler depsManager;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmStateSnapshot snapshot;
  cmDepends clearer;
  cmMakefile lmf;
  path local_a18;
  cmMakefile *local_9f0;
  path local_9e8;
  long *local_9c0;
  size_t local_9b8;
  long local_9b0 [2];
  path local_9a0;
  path local_978;
  path local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string *local_908;
  cmDependsCompiler local_900;
  string local_8f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d0;
  cmStateSnapshot local_8b8;
  cmDepends local_8a0;
  undefined1 local_828 [2040];
  
  local_828._0_8_ = local_828 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"CMAKE_DEPEND_INFO_FILES","");
  local_9f0 = mf;
  cVar3 = cmMakefile::GetDefinition(mf,(string *)local_828);
  if ((undefined1 *)local_828._0_8_ != local_828 + 0x10) {
    operator_delete((void *)local_828._0_8_,local_828._16_8_ + 1);
  }
  if (cVar3.Value != (string *)0x0) {
    arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar3.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_8d0,arg,false);
    local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0);
    cmDepends::cmDepends(&local_8a0,(cmLocalUnixMakefileGenerator3 *)0x0,&local_8f0);
    this_01 = local_9f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
      operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
    }
    local_908 = local_8d0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_8a0.Verbose = verbose;
    if (local_8d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_8d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      filename = local_8d0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_00 = cmMakefile::GetState(this_01);
        cmState::CreateBaseSnapshot(&local_8b8,this_00);
        globalGenerator = cmMakefile::GetGlobalGenerator(this_01);
        cmMakefile::cmMakefile((cmMakefile *)local_828,globalGenerator,&local_8b8);
        cmMakefile::ReadListFile((cmMakefile *)local_828,filename);
        local_a18._M_pathname._M_dataplus._M_p = (pointer)&local_a18._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a18,"CMAKE_DEPENDS_LANGUAGES","");
        psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)local_828,&local_a18._M_pathname);
        sVar1 = psVar4->_M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a18._M_pathname._M_dataplus._M_p != &local_a18._M_pathname.field_2) {
          operator_delete(local_a18._M_pathname._M_dataplus._M_p,
                          local_a18._M_pathname.field_2._M_allocated_capacity + 1);
        }
        this_01 = local_9f0;
        if (sVar1 != 0) {
          cmsys::SystemTools::GetFilenamePath(&local_a18._M_pathname,filename);
          local_9a0._M_pathname._M_dataplus._M_p = (pointer)&local_9a0._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9a0,local_a18._M_pathname._M_dataplus._M_p,
                     local_a18._M_pathname._M_dataplus._M_p + local_a18._M_pathname._M_string_length
                    );
          std::__cxx11::string::append((char *)&local_9a0);
          cmDepends::Clear(&local_8a0,&local_9a0._M_pathname);
          local_9e8._M_pathname._M_dataplus._M_p = (pointer)&local_9e8._M_pathname.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9e8,local_a18._M_pathname._M_dataplus._M_p,
                     local_a18._M_pathname._M_dataplus._M_p + local_a18._M_pathname._M_string_length
                    );
          std::__cxx11::string::append((char *)&local_9e8);
          cmsys::SystemTools::RemoveFile(&local_9e8._M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9e8._M_pathname._M_dataplus._M_p != &local_9e8._M_pathname.field_2) {
            operator_delete(local_9e8._M_pathname._M_dataplus._M_p,
                            local_9e8._M_pathname.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9a0._M_pathname._M_dataplus._M_p != &local_9a0._M_pathname.field_2) {
            operator_delete(local_9a0._M_pathname._M_dataplus._M_p,
                            local_9a0._M_pathname.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_pathname._M_dataplus._M_p != &local_a18._M_pathname.field_2) {
            operator_delete(local_a18._M_pathname._M_dataplus._M_p,
                            local_a18._M_pathname.field_2._M_allocated_capacity + 1);
          }
        }
        local_a18._M_pathname._M_dataplus._M_p = (pointer)&local_a18._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a18,"CMAKE_DEPENDS_DEPENDENCY_FILES","");
        psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)local_828,&local_a18._M_pathname);
        local_9c0 = local_9b0;
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9c0,pcVar2,pcVar2 + psVar4->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a18._M_pathname._M_dataplus._M_p != &local_a18._M_pathname.field_2) {
          operator_delete(local_a18._M_pathname._M_dataplus._M_p,
                          local_a18._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_9b8 != 0) {
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          pcVar2 = (filename->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_928,pcVar2,pcVar2 + filename->_M_string_length);
          cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                    ((cmCMakePath *)&local_9a0,&local_928,generic_format);
          cmCMakePath::GetParentPath((cmCMakePath *)&local_a18,(cmCMakePath *)&local_9a0);
          std::filesystem::__cxx11::path::~path(&local_9a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_928._M_dataplus._M_p != &local_928.field_2) {
            operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::path(&local_9e8,&local_a18);
          ppVar5 = &cmCMakePath::Append<char[21],cmCMakePath&>
                              ((cmCMakePath *)&local_9e8,(char (*) [21])0x7dfad8)->Path;
          std::filesystem::__cxx11::path::path(&local_9a0,ppVar5);
          std::filesystem::__cxx11::path::~path(&local_9e8);
          std::filesystem::__cxx11::path::
          generic_string<char,std::char_traits<char>,std::allocator<char>>
                    (&local_9e8._M_pathname,&local_9a0,(allocator<char> *)&local_978);
          cmDepends::Clear(&local_8a0,&local_9e8._M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9e8._M_pathname._M_dataplus._M_p != &local_9e8._M_pathname.field_2) {
            operator_delete(local_9e8._M_pathname._M_dataplus._M_p,
                            local_9e8._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::path(&local_978,&local_a18);
          ppVar5 = &cmCMakePath::Append<char[25],cmCMakePath&>
                              ((cmCMakePath *)&local_978,(char (*) [25])0x7dfabe)->Path;
          std::filesystem::__cxx11::path::path(&local_9e8,ppVar5);
          std::filesystem::__cxx11::path::~path(&local_978);
          std::filesystem::__cxx11::path::
          generic_string<char,std::char_traits<char>,std::allocator<char>>
                    (&local_978._M_pathname,&local_9e8,(allocator<char> *)&local_950);
          cmsys::SystemTools::RemoveFile(&local_978._M_pathname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_978._M_pathname._M_dataplus._M_p != &local_978._M_pathname.field_2) {
            operator_delete(local_978._M_pathname._M_dataplus._M_p,
                            local_978._M_pathname.field_2._M_allocated_capacity + 1);
          }
          std::filesystem::__cxx11::path::path(&local_950,&local_a18);
          ppVar5 = &cmCMakePath::Append<char[19],cmCMakePath&>
                              ((cmCMakePath *)&local_950,(char (*) [19])0x7e039d)->Path;
          std::filesystem::__cxx11::path::path(&local_978,ppVar5);
          std::filesystem::__cxx11::path::~path(&local_950);
          std::filesystem::__cxx11::path::
          generic_string<char,std::char_traits<char>,std::allocator<char>>
                    (&local_950._M_pathname,&local_978,(allocator<char> *)&local_900);
          cmsys::SystemTools::Touch(&local_950._M_pathname,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_950._M_pathname._M_dataplus._M_p != &local_950._M_pathname.field_2) {
            operator_delete(local_950._M_pathname._M_dataplus._M_p,
                            local_950._M_pathname.field_2._M_allocated_capacity + 1);
          }
          arg_00._M_str = (char *)local_9c0;
          arg_00._M_len = local_9b8;
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_950,arg_00,true);
          local_900.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
          local_900.Verbose = verbose;
          cmDependsCompiler::ClearDependencies
                    (&local_900,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_950);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_950);
          std::filesystem::__cxx11::path::~path(&local_978);
          std::filesystem::__cxx11::path::~path(&local_9e8);
          std::filesystem::__cxx11::path::~path(&local_9a0);
          std::filesystem::__cxx11::path::~path(&local_a18);
          this_01 = local_9f0;
        }
        if (local_9c0 != local_9b0) {
          operator_delete(local_9c0,local_9b0[0] + 1);
        }
        cmMakefile::~cmMakefile((cmMakefile *)local_828);
        filename = filename + 1;
      } while (filename != local_908);
    }
    cmDepends::~cmDepends(&local_8a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8d0);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ClearDependencies(cmMakefile* mf,
                                                      bool verbose)
{
  // Get the list of target files to check
  cmValue infoDef = mf->GetDefinition("CMAKE_DEPEND_INFO_FILES");
  if (!infoDef) {
    return;
  }
  std::vector<std::string> files = cmExpandedList(*infoDef);

  // Each depend information file corresponds to a target.  Clear the
  // dependencies for that target.
  cmDepends clearer;
  clearer.SetVerbose(verbose);
  for (std::string const& file : files) {
    auto snapshot = mf->GetState()->CreateBaseSnapshot();
    cmMakefile lmf(mf->GetGlobalGenerator(), snapshot);
    lmf.ReadListFile(file);

    if (!lmf.GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(file);

      // Clear the implicit dependency makefile.
      std::string dependFile = dir + "/depend.make";
      clearer.Clear(dependFile);

      // Remove the internal dependency check file to force
      // regeneration.
      std::string internalDependFile = dir + "/depend.internal";
      cmSystemTools::RemoveFile(internalDependFile);
    }

    auto depsFiles = lmf.GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
    if (!depsFiles.empty()) {
      auto dir = cmCMakePath(file).GetParentPath();
      // Clear the implicit dependency makefile.
      auto depFile = cmCMakePath(dir).Append("compiler_depend.make");
      clearer.Clear(depFile.GenericString());

      // Remove the internal dependency check file
      auto internalDepFile =
        cmCMakePath(dir).Append("compiler_depend.internal");
      cmSystemTools::RemoveFile(internalDepFile.GenericString());

      // Touch timestamp file to force dependencies regeneration
      auto DepTimestamp = cmCMakePath(dir).Append("compiler_depend.ts");
      cmSystemTools::Touch(DepTimestamp.GenericString(), true);

      // clear the dependencies files generated by the compiler
      std::vector<std::string> dependencies = cmExpandedList(depsFiles, true);
      cmDependsCompiler depsManager;
      depsManager.SetVerbose(verbose);
      depsManager.ClearDependencies(dependencies);
    }
  }
}